

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 __thiscall
tcu::ConstPixelBufferAccess::getPixel(ConstPixelBufferAccess *this,int x,int y,int z)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ChannelOrder type;
  Channel CVar5;
  uint uVar6;
  int i;
  int iVar7;
  Float<unsigned_int,_8,_23,_127,_3U> FVar8;
  Float<unsigned_int,_8,_23,_127,_3U> FVar9;
  Float<unsigned_int,_8,_23,_127,_3U> FVar10;
  TextureSwizzle *pTVar11;
  ushort uVar12;
  Vector<float,_4> *res;
  uint uVar13;
  undefined4 in_register_00000034;
  ChannelOrder *pCVar14;
  uint uVar15;
  int in_R8D;
  int c;
  long lVar16;
  uint *puVar17;
  float extraout_XMM0_Da;
  float fVar18;
  float extraout_XMM0_Da_00;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  float fVar19;
  ulong in_XMM1_Qa;
  undefined4 uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  Vec4 VVar24;
  Float<unsigned_int,_5,_6,_15,_2U> local_48;
  uint local_44;
  undefined8 local_40;
  Float<unsigned_int,_5,_5,_15,_2U> local_38;
  Float<unsigned_int,_5,_6,_15,_2U> local_34;
  
  pCVar14 = (ChannelOrder *)CONCAT44(in_register_00000034,x);
  puVar17 = (uint *)((long)(int)(in_R8D * pCVar14[7]) + (long)(int)(z * pCVar14[6]) +
                    (long)(int)(y * pCVar14[5]) + *(undefined8 *)(pCVar14 + 8));
  type = pCVar14[1];
  uVar20 = (undefined4)(in_XMM1_Qa >> 0x20);
  switch(type) {
  case L:
    switch(*pCVar14) {
    case RGB:
    case sRGB:
      fVar18 = (float)(byte)*puVar17 / 255.0;
      fVar19 = (float)*(byte *)((long)puVar17 + 1) / 255.0;
      in_XMM1_Qa = CONCAT44(uVar20,fVar19);
      fVar22 = (float)*(byte *)((long)puVar17 + 2) / 255.0;
      (this->m_format).order = (ChannelOrder)fVar18;
      (this->m_format).type = (ChannelType)fVar19;
      break;
    case RGBA:
    case sRGBA:
      in_XMM1_Qa = 0x437f0000;
      bVar1 = *(byte *)((long)puVar17 + 1);
      bVar2 = *(byte *)((long)puVar17 + 2);
      fVar18 = (float)(byte)*puVar17 / 255.0;
      bVar3 = *(byte *)((long)puVar17 + 3);
      (this->m_format).order = (ChannelOrder)fVar18;
      (this->m_format).type = (ChannelType)((float)bVar1 / 255.0);
      (this->m_size).m_data[0] = (int)((float)bVar2 / 255.0);
      (this->m_size).m_data[1] = (int)((float)bVar3 / 255.0);
      goto LAB_005e8566;
    default:
      switch(type) {
      case RGB:
        goto switchD_005e7df4_caseD_7;
      case RGBA:
        goto switchD_005e7df4_caseD_8;
      case ARGB:
        goto switchD_005e7df4_caseD_9;
      case BGR:
        goto switchD_005e7df4_caseD_a;
      case BGRA:
        goto switchD_005e7df4_caseD_b;
      case sR:
        goto switchD_005e7df4_caseD_c;
      case sRG:
        goto switchD_005e7df4_caseD_d;
      case sRGB:
        goto switchD_005e7df4_caseD_e;
      case sRGBA:
        goto switchD_005e7df4_caseD_f;
      case sBGR:
        goto switchD_005e7df4_caseD_10;
      case sBGRA:
        goto switchD_005e7df4_caseD_11;
      case D:
        goto switchD_005e7df4_caseD_12;
      case S:
        goto switchD_005e7df4_caseD_13;
      case DS:
        goto switchD_005e7df4_caseD_14;
      case CHANNELORDER_LAST:
        goto switchD_005e7df4_caseD_15;
      case DS|I:
        goto switchD_005e7df4_caseD_16;
      case DS|L:
        goto switchD_005e7df4_caseD_17;
      default:
        goto switchD_005e7df4_caseD_4;
      }
    }
    goto LAB_005e8545;
  default:
switchD_005e7df4_caseD_4:
    (this->m_format).order = R;
    (this->m_format).type = SNORM_INT8;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0;
    pTVar11 = getChannelReadSwizzle(*pCVar14);
    iVar7 = getChannelSize(type);
    lVar16 = 0;
    fVar18 = extraout_XMM0_Da;
    in_XMM0_Db = extraout_XMM0_Db;
    do {
      CVar5 = pTVar11->components[lVar16];
      if (CVar5 < CHANNEL_ZERO) {
        fVar18 = anon_unknown_74::channelToFloat
                           ((byte *)((long)(int)(CVar5 * iVar7) + (long)puVar17),pCVar14[1]);
        in_XMM0_Db = extraout_XMM0_Db_00;
LAB_005e8203:
        (this->m_size).m_data[lVar16 + -2] = (int)fVar18;
      }
      else {
        if (CVar5 == CHANNEL_ZERO) {
          fVar18 = 0.0;
          in_XMM0_Db = 0;
          goto LAB_005e8203;
        }
        if (CVar5 == CHANNEL_ONE) {
          fVar18 = 1.0;
          in_XMM0_Db = 0;
          goto LAB_005e8203;
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    goto LAB_005e8566;
  case RGB:
switchD_005e7df4_caseD_7:
    uVar6 = *puVar17;
    in_XMM1_Qa = 0x41700000;
    fVar18 = (float)(byte)((byte)uVar6 >> 4) / 15.0;
    (this->m_format).order = (ChannelOrder)fVar18;
    (this->m_format).type = (ChannelType)((float)((byte)uVar6 & 0xf) / 15.0);
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0x3f800000;
    goto LAB_005e8566;
  case RGBA:
switchD_005e7df4_caseD_8:
    uVar4 = (ushort)*puVar17;
    uVar12 = uVar4 >> 0xb;
    fVar19 = (float)(uVar4 >> 5 & 0x3f) / 63.0;
    goto LAB_005e8261;
  case ARGB:
switchD_005e7df4_caseD_9:
    uVar4 = (ushort)*puVar17;
    uVar12 = uVar4 >> 10 & 0x1f;
    fVar19 = (float)(uVar4 >> 5 & 0x1f) / 31.0;
LAB_005e8261:
    in_XMM1_Qa = CONCAT44(uVar20,fVar19);
    fVar18 = (float)uVar12 / 31.0;
    fVar21 = (float)(uVar4 & 0x1f) / 31.0;
    if (*pCVar14 == RGB) {
      (this->m_format).order = (ChannelOrder)fVar18;
      (this->m_format).type = (ChannelType)fVar19;
      (this->m_size).m_data[0] = (int)fVar21;
    }
    else {
      (this->m_format).order = (ChannelOrder)fVar21;
      (this->m_format).type = (ChannelType)fVar19;
      (this->m_size).m_data[0] = (int)fVar18;
    }
LAB_005e854a:
    (this->m_size).m_data[1] = 0x3f800000;
    goto LAB_005e8566;
  case BGR:
switchD_005e7df4_caseD_a:
    uVar4 = (ushort)*puVar17;
    fVar18 = (float)(uVar4 >> 0xc) / 15.0;
    in_XMM1_Qa = CONCAT44(uVar20,(float)(uVar4 >> 8 & 0xf) / 15.0);
    fVar19 = (float)(uVar4 >> 4 & 0xf) / 15.0;
    fVar21 = (float)(uVar4 & 0xf) / 15.0;
    break;
  case BGRA:
switchD_005e7df4_caseD_b:
    uVar4 = (ushort)*puVar17;
    fVar18 = (float)(uVar4 >> 0xb) / 31.0;
    fVar21 = (float)(uVar4 & 1);
    in_XMM1_Qa = CONCAT44(uVar20,(float)(uVar4 >> 6 & 0x1f) / 31.0);
    fVar19 = (float)(uVar4 >> 1 & 0x1f) / 31.0;
    break;
  case sR:
switchD_005e7df4_caseD_c:
    uVar4 = (ushort)*puVar17;
    fVar18 = (float)(uVar4 >> 0xf);
    fVar19 = (float)(uVar4 >> 10 & 0x1f) / 31.0;
    in_XMM1_Qa = CONCAT44(uVar20,fVar19);
    (this->m_format).order = (ChannelOrder)fVar19;
    (this->m_format).type = (ChannelType)((float)(uVar4 >> 5 & 0x1f) / 31.0);
    (this->m_size).m_data[0] = (int)((float)(uVar4 & 0x1f) / 31.0);
    goto LAB_005e8561;
  case sRG:
switchD_005e7df4_caseD_d:
    uVar6 = *puVar17;
    in_XMM1_Qa = 0x447fc000;
    fVar18 = (float)(uVar6 >> 0x16) / 1023.0;
    fVar21 = (float)(uVar6 >> 0xc & 0x3ff) / 1023.0;
    fVar22 = (float)(uVar6 >> 2 & 0x3ff) / 1023.0;
    (this->m_format).order = (ChannelOrder)fVar18;
    goto LAB_005e8540;
  case sRGB:
switchD_005e7df4_caseD_e:
    uVar6 = *puVar17;
    fVar18 = (float)(int)(-(uVar6 & 0x200) | uVar6 & 0x3ff) / 511.0;
    in_XMM0_Db = 0;
    fVar19 = -1.0;
    if (-1.0 <= fVar18) {
      fVar19 = fVar18;
    }
    in_XMM1_Qa = (ulong)(uint)fVar19;
    fVar18 = (float)(int)(-(uVar6 >> 10 & 0x200) | uVar6 >> 10 & 0x3ff) / 511.0;
    fVar21 = -1.0;
    if (-1.0 <= fVar18) {
      fVar21 = fVar18;
    }
    fVar18 = (float)(int)(-(uVar6 >> 0x14 & 0x200) | uVar6 >> 0x14 & 0x3ff) / 511.0;
    fVar23 = (float)(int)(-(uVar6 >> 0x1e & 0xfffffffe) | uVar6 >> 0x1e);
    fVar22 = -1.0;
    if (-1.0 <= fVar18) {
      fVar22 = fVar18;
    }
    fVar18 = -1.0;
    if (-1.0 <= fVar23) {
      fVar18 = fVar23;
    }
    if (*pCVar14 == RGBA) {
      (this->m_format).order = (ChannelOrder)fVar19;
      (this->m_format).type = (ChannelType)fVar21;
      (this->m_size).m_data[0] = (int)fVar22;
    }
    else {
      (this->m_format).order = (ChannelOrder)fVar22;
      (this->m_format).type = (ChannelType)fVar21;
      (this->m_size).m_data[0] = (int)fVar19;
    }
LAB_005e8561:
    (this->m_size).m_data[1] = (int)fVar18;
    goto LAB_005e8566;
  case sRGBA:
switchD_005e7df4_caseD_f:
    uVar6 = *puVar17;
    fVar18 = (float)(uVar6 & 0x3ff) / 1023.0;
    in_XMM1_Qa = CONCAT44(uVar20,(float)(uVar6 >> 10 & 0x3ff) / 1023.0);
    fVar19 = (float)(uVar6 >> 0x14 & 0x3ff) / 1023.0;
    fVar21 = (float)(uVar6 >> 0x1e) / 3.0;
    break;
  case sBGR:
switchD_005e7df4_caseD_10:
    local_48.m_value = (uint)(byte)((byte)*puVar17 >> 4);
    local_44 = (byte)*puVar17 & 0xf;
    local_40 = 0x100000000;
    (this->m_format).order = R;
    (this->m_format).type = SNORM_INT8;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0;
    lVar16 = 0;
    do {
      in_XMM0_Db = 0;
      fVar18 = (float)(&local_48)[lVar16].m_value;
      (this->m_size).m_data[lVar16 + -2] = (int)fVar18;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    goto LAB_005e8566;
  case sBGRA:
switchD_005e7df4_caseD_11:
    uVar4 = (ushort)*puVar17;
    local_48.m_value = (StorageType)(uVar4 >> 0xb);
    uVar6 = uVar4 & 0x1f;
    if (*pCVar14 != RGB) {
      uVar6 = local_48.m_value;
      local_48.m_value = uVar4 & 0x1f;
    }
    local_44 = uVar4 >> 5 & 0x3f;
    local_40 = CONCAT44(1,uVar6);
    (this->m_format).order = R;
    (this->m_format).type = SNORM_INT8;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0;
    lVar16 = 0;
    do {
      in_XMM0_Db = 0;
      fVar18 = (float)(&local_48)[lVar16].m_value;
      (this->m_size).m_data[lVar16 + -2] = (int)fVar18;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    goto LAB_005e8566;
  case D:
switchD_005e7df4_caseD_12:
    uVar4 = (ushort)*puVar17;
    local_48.m_value = (StorageType)(uVar4 >> 0xc);
    uVar13 = uVar4 >> 4 & 0xf;
    uVar6 = uVar13;
    if (*pCVar14 != RGBA) {
      uVar6 = local_48.m_value;
      local_48.m_value = uVar13;
    }
    local_44 = uVar4 >> 8 & 0xf;
    local_40 = (ulong)CONCAT24(uVar4,uVar6) & 0xfffffffff;
    (this->m_format).order = R;
    (this->m_format).type = SNORM_INT8;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0;
    lVar16 = 0;
    do {
      in_XMM0_Db = 0;
      fVar18 = (float)(&local_48)[lVar16].m_value;
      (this->m_size).m_data[lVar16 + -2] = (int)fVar18;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    goto LAB_005e8566;
  case S:
switchD_005e7df4_caseD_13:
    uVar4 = (ushort)*puVar17;
    local_48.m_value = (StorageType)(uVar4 >> 0xb);
    uVar13 = uVar4 >> 1 & 0x1f;
    uVar6 = uVar13;
    if (*pCVar14 != RGBA) {
      uVar6 = local_48.m_value;
      local_48.m_value = uVar13;
    }
    local_44 = uVar4 >> 6 & 0x1f;
    local_40 = (ulong)CONCAT24(uVar4,uVar6) & 0x1ffffffff;
    (this->m_format).order = R;
    (this->m_format).type = SNORM_INT8;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0;
    lVar16 = 0;
    do {
      in_XMM0_Db = 0;
      fVar18 = (float)(&local_48)[lVar16].m_value;
      (this->m_size).m_data[lVar16 + -2] = (int)fVar18;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    goto LAB_005e8566;
  case DS:
switchD_005e7df4_caseD_14:
    uVar6 = *puVar17;
    local_48.m_value = -(uVar6 & 0x200) | uVar6 & 0x3ff;
    uVar15 = -(uVar6 >> 0x14 & 0x200) | uVar6 >> 0x14 & 0x3ff;
    uVar13 = uVar15;
    if (*pCVar14 != RGBA) {
      uVar13 = local_48.m_value;
      local_48.m_value = uVar15;
    }
    local_44 = -(uVar6 >> 10 & 0x200) | uVar6 >> 10 & 0x3ff;
    local_40 = CONCAT44(-(uVar6 >> 0x1e & 0xfffffffe) | uVar6 >> 0x1e,uVar13);
    (this->m_format).order = R;
    (this->m_format).type = SNORM_INT8;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0;
    lVar16 = 0;
    do {
      in_XMM0_Db = 0;
      fVar18 = (float)(&local_48)[lVar16].m_value;
      (this->m_size).m_data[lVar16 + -2] = (int)fVar18;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    goto LAB_005e8566;
  case CHANNELORDER_LAST:
switchD_005e7df4_caseD_15:
    uVar6 = *puVar17;
    local_48.m_value = uVar6 & 0x3ff;
    uVar15 = uVar6 >> 0x14 & 0x3ff;
    uVar13 = uVar15;
    if (*pCVar14 != RGBA) {
      uVar13 = local_48.m_value;
      local_48.m_value = uVar15;
    }
    local_44 = uVar6 >> 10 & 0x3ff;
    local_40 = CONCAT44(uVar6 >> 0x1e,uVar13);
    (this->m_format).order = R;
    (this->m_format).type = SNORM_INT8;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0;
    lVar16 = 0;
    do {
      in_XMM0_Db = 0;
      fVar18 = (float)(&local_48)[lVar16].m_value;
      (this->m_size).m_data[lVar16 + -2] = (int)fVar18;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    goto LAB_005e8566;
  case DS|I:
switchD_005e7df4_caseD_16:
    local_48.m_value = *puVar17 & 0x7ff;
    FVar8 = Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,6,15,2u>(&local_48);
    local_34.m_value = *puVar17 >> 0xb & 0x7ff;
    FVar9 = Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,6,15,2u>(&local_34);
    local_38.m_value = *puVar17 >> 0x16;
    FVar10 = Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,5,15,2u>(&local_38);
    (this->m_format).order = FVar8.m_value;
    (this->m_format).type = FVar9.m_value;
    (this->m_size).m_data[0] = FVar10.m_value;
    fVar18 = extraout_XMM0_Da_00;
    in_XMM0_Db = extraout_XMM0_Db_01;
    goto LAB_005e854a;
  case DS|L:
switchD_005e7df4_caseD_17:
    uVar6 = *puVar17;
    fVar18 = ldexpf(1.0,(uVar6 >> 0x1b) - 0x18);
    fVar19 = (float)(uVar6 & 0x1ff) * fVar18;
    in_XMM1_Qa = CONCAT44((int)(in_XMM1_Qa >> 0x20),fVar19);
    fVar21 = (float)(uVar6 >> 9 & 0x1ff) * fVar18;
    fVar22 = (float)(uVar6 >> 0x12 & 0x1ff) * fVar18;
    (this->m_format).order = (ChannelOrder)fVar19;
    in_XMM0_Db = extraout_XMM0_Db_02;
LAB_005e8540:
    (this->m_format).type = (ChannelType)fVar21;
LAB_005e8545:
    (this->m_size).m_data[0] = (int)fVar22;
    goto LAB_005e854a;
  }
  if (*pCVar14 == RGBA) {
    (this->m_format).order = (ChannelOrder)fVar18;
    (this->m_format).type = (ChannelType)in_XMM1_Qa;
    (this->m_size).m_data[0] = (int)fVar19;
  }
  else {
    (this->m_format).order = (ChannelOrder)fVar19;
    (this->m_format).type = (ChannelType)in_XMM1_Qa;
    (this->m_size).m_data[0] = (int)fVar18;
  }
  (this->m_size).m_data[1] = (int)fVar21;
LAB_005e8566:
  VVar24.m_data[1] = (float)in_XMM0_Db;
  VVar24.m_data[0] = fVar18;
  VVar24.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar24.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  return (Vec4)VVar24.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::getPixel (int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, m_size.x()));
	DE_ASSERT(de::inBounds(y, 0, m_size.y()));
	DE_ASSERT(de::inBounds(z, 0, m_size.z()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	const deUint8* pixelPtr = (const deUint8*)getPixelPtr(x, y, z);

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
			return readRGBA8888Float(pixelPtr);
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
			return readRGB888Float(pixelPtr);
	}

#define UI8(OFFS, COUNT)		((*((const deUint8*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define UI16(OFFS, COUNT)		((*((const deUint16*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define UI32(OFFS, COUNT)		((*((const deUint32*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define SI32(OFFS, COUNT)		signExtend(UI32(OFFS, COUNT), (COUNT))
#define UN8(OFFS, COUNT)		channelToUnormFloat(UI8 (OFFS, COUNT), (COUNT))
#define UN16(OFFS, COUNT)		channelToUnormFloat(UI16(OFFS, COUNT), (COUNT))
#define UN32(OFFS, COUNT)		channelToUnormFloat(UI32(OFFS, COUNT), (COUNT))
#define SN32(OFFS, COUNT)		channelToSnormFloat(UI32(OFFS, COUNT), (COUNT))

	// Packed formats.
	switch (m_format.type)
	{
		case TextureFormat::UNORM_BYTE_44:				return			  Vec4(UN8 (4,   4), UN8 ( 0,  4), 0.0f, 1.0f);
		case TextureFormat::UNSIGNED_BYTE_44:			return			 UVec4(UI8 (4,   4), UI8 ( 0,  4), 0u, 1u).cast<float>();
		case TextureFormat::UNORM_SHORT_565:			return swizzleRB( Vec4(UN16(11,  5), UN16( 5,  6), UN16( 0,  5), 1.0f), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNSIGNED_SHORT_565:			return swizzleRB(UVec4(UI16(11,  5), UI16( 5,  6), UI16( 0,  5), 1u), m_format.order, TextureFormat::RGB).cast<float>();
		case TextureFormat::UNORM_SHORT_555:			return swizzleRB( Vec4(UN16(10,  5), UN16( 5,  5), UN16( 0,  5), 1.0f), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNORM_SHORT_4444:			return swizzleRB( Vec4(UN16(12,  4), UN16( 8,  4), UN16( 4,  4), UN16( 0, 4)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_SHORT_4444:		return swizzleRB(UVec4(UI16(12,  4), UI16( 8,  4), UI16( 4,  4), UI16( 0, 4)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::UNORM_SHORT_5551:			return swizzleRB( Vec4(UN16(11,  5), UN16( 6,  5), UN16( 1,  5), UN16( 0, 1)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_SHORT_5551:		return swizzleRB(UVec4(UI16(11,  5), UI16( 6,  5), UI16( 1,  5), UI16( 0, 1)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::UNORM_INT_101010:			return			  Vec4(UN32(22, 10), UN32(12, 10), UN32( 2, 10), 1.0f);
		case TextureFormat::UNORM_INT_1010102_REV:		return swizzleRB( Vec4(UN32( 0, 10), UN32(10, 10), UN32(20, 10), UN32(30, 2)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::SNORM_INT_1010102_REV:		return swizzleRB( Vec4(SN32( 0, 10), SN32(10, 10), SN32(20, 10), SN32(30, 2)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_INT_1010102_REV:	return swizzleRB( UVec4(UI32(0, 10), UI32(10, 10), UI32(20, 10), UI32(30, 2)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::SIGNED_INT_1010102_REV:		return swizzleRB( UVec4(SI32(0, 10), SI32(10, 10), SI32(20, 10), SI32(30, 2)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::UNSIGNED_INT_999_E5_REV:	return unpackRGB999E5(*((const deUint32*)pixelPtr));

		case TextureFormat::UNORM_SHORT_1555:
			DE_ASSERT(m_format.order == TextureFormat::ARGB);
			return Vec4(UN16(15, 1), UN16(10, 5), UN16(5, 5), UN16(0, 5)).swizzle(1,2,3,0); // ARGB -> RGBA

		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
			return Vec4(Float11(UI32(0, 11)).asFloat(), Float11(UI32(11, 11)).asFloat(), Float10(UI32(22, 10)).asFloat(), 1.0f);

		default:
			break;
	}

#undef UN8
#undef UN16
#undef UN32
#undef SN32
#undef SI32
#undef UI8
#undef UI16
#undef UI32

	// Generic path.
	Vec4							result;
	const TextureSwizzle::Channel*	channelMap	= getChannelReadSwizzle(m_format.order).components;
	int								channelSize	= getChannelSize(m_format.type);

	for (int c = 0; c < 4; c++)
	{
		switch (channelMap[c])
		{
			case TextureSwizzle::CHANNEL_0:
			case TextureSwizzle::CHANNEL_1:
			case TextureSwizzle::CHANNEL_2:
			case TextureSwizzle::CHANNEL_3:
				result[c] = channelToFloat(pixelPtr + channelSize*((int)channelMap[c]), m_format.type);
				break;

			case TextureSwizzle::CHANNEL_ZERO:
				result[c] = 0.0f;
				break;

			case TextureSwizzle::CHANNEL_ONE:
				result[c] = 1.0f;
				break;

			default:
				DE_ASSERT(false);
		}
	}

	return result;
}